

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

Bmc_Mna_t * Bmc_MnaAlloc(void)

{
  int iVar1;
  Bmc_Mna_t *pBVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  sat_solver *s;
  abctime aVar5;
  timespec ts;
  timespec local_28;
  
  pBVar2 = (Bmc_Mna_t *)calloc(1,0x50);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  pBVar2->vId2Var = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pBVar2->vInputs = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pBVar2->vOutputs = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 10000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(40000);
  pVVar3->pArray = piVar4;
  pBVar2->vNodes = pVVar3;
  s = sat_solver_new();
  pBVar2->pSat = s;
  pBVar2->nSatVars = 1;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    aVar5 = -1;
  }
  else {
    aVar5 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  pBVar2->clkStart = aVar5;
  sat_solver_setnvars(s,1000);
  return pBVar2;
}

Assistant:

Bmc_Mna_t * Bmc_MnaAlloc()
{
    Bmc_Mna_t * p;
    p = ABC_CALLOC( Bmc_Mna_t, 1 );
    p->vId2Var   = Vec_IntAlloc( 0 );
    p->vInputs   = Vec_IntAlloc( 1000 );
    p->vOutputs  = Vec_IntAlloc( 1000 );
    p->vNodes    = Vec_IntAlloc( 10000 );
    p->pSat      = sat_solver_new();
    p->nSatVars  = 1;
    p->clkStart  = Abc_Clock();
    sat_solver_setnvars( p->pSat, 1000 );
    return p;
}